

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

UnpackedRecord * sqlite3VdbeAllocUnpackedRecord(KeyInfo *pKeyInfo)

{
  KeyInfo *in_RDI;
  int nByte;
  UnpackedRecord *p;
  undefined4 in_stack_ffffffffffffffe0;
  UnpackedRecord *local_8;
  
  local_8 = (UnpackedRecord *)
            sqlite3DbMallocRaw((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,
                               CONCAT44((in_RDI->nKeyField + 1) * 0x38 + 0x28,
                                        in_stack_ffffffffffffffe0));
  if (local_8 == (UnpackedRecord *)0x0) {
    local_8 = (UnpackedRecord *)0x0;
  }
  else {
    local_8->aMem = (Mem *)(local_8 + 1);
    local_8->pKeyInfo = in_RDI;
    local_8->nField = in_RDI->nKeyField + 1;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE UnpackedRecord *sqlite3VdbeAllocUnpackedRecord(
  KeyInfo *pKeyInfo               /* Description of the record */
){
  UnpackedRecord *p;              /* Unpacked record to return */
  int nByte;                      /* Number of bytes required for *p */
  nByte = ROUND8P(sizeof(UnpackedRecord)) + sizeof(Mem)*(pKeyInfo->nKeyField+1);
  p = (UnpackedRecord *)sqlite3DbMallocRaw(pKeyInfo->db, nByte);
  if( !p ) return 0;
  p->aMem = (Mem*)&((char*)p)[ROUND8P(sizeof(UnpackedRecord))];
  assert( pKeyInfo->aSortFlags!=0 );
  p->pKeyInfo = pKeyInfo;
  p->nField = pKeyInfo->nKeyField + 1;
  return p;
}